

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O2

bool __thiscall trun::Process_Unix::PrepareFileDescriptors(Process_Unix *this)

{
  int __errnum;
  ILogger *this_00;
  char *arguments_2;
  allocator<char> local_31;
  string local_30;
  
  __errnum = posix_spawn_file_actions_init((posix_spawn_file_actions_t *)&this->child_fd_actions);
  if (__errnum != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"Process_Unix",&local_31)
    ;
    this_00 = gnilk::Logger::GetLogger(&local_30);
    arguments_2 = strerror(__errnum);
    gnilk::Log::Error<char_const*,int,char*>
              (this_00,"posix_spawn_file_actions_init %d, %s",__errnum,arguments_2);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return __errnum == 0;
}

Assistant:

bool Process_Unix::PrepareFileDescriptors() {
	int status = posix_spawn_file_actions_init(&child_fd_actions);
	if (status != 0) {
        gnilk::Logger::GetLogger("Process_Unix")->Error("posix_spawn_file_actions_init %d, %s", status, strerror(status));
		return false;
	}
	return true;
}